

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_16x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  transform_1d_sse2 p_Var3;
  transform_1d_sse2 p_Var4;
  int8_t *piVar5;
  int iVar6;
  int iVar7;
  byte in_CL;
  __m128i *buf;
  int i_1;
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [64];
  __m128i buf0 [32];
  int in_stack_fffffffffffff98c;
  __m128i *in_stack_fffffffffffff990;
  __m128i *out;
  uint in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a4;
  longlong local_628 [5];
  __m128i *in_stack_fffffffffffffa00;
  __m128i *in_stack_fffffffffffffa08;
  longlong local_228 [66];
  byte local_15;
  
  piVar5 = av1_fwd_txfm_shift_ls[9];
  local_15 = in_CL;
  iVar6 = get_txw_idx('\t');
  iVar7 = get_txh_idx('\t');
  iVar1 = av1_fwd_cos_bit_col[iVar6][iVar7];
  iVar2 = av1_fwd_cos_bit_row[iVar6][iVar7];
  p_Var3 = col_txfm8x32_arr[local_15];
  p_Var4 = row_txfm8x16_arr[local_15];
  if ((p_Var3 == (transform_1d_sse2)0x0) || (p_Var4 == (transform_1d_sse2)0x0)) {
    av1_fwd_txfm2d_16x32_c
              ((int16_t *)buf1[0x19][1],(int32_t *)buf1[0x19][0],buf1[0x18][1]._4_4_,
               buf1[0x18][1]._3_1_,buf1[0x18][0]._4_4_);
  }
  else {
    get_flip_cfg(local_15,(int *)&stack0xfffffffffffff9a4,(int *)&stack0xfffffffffffff9a0);
    for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
      if (in_stack_fffffffffffff9a4 == 0) {
        load_buffer_16bit_to_16bit
                  ((int16_t *)(ulong)in_stack_fffffffffffff9a0,iVar6,in_stack_fffffffffffff990,
                   in_stack_fffffffffffff98c);
      }
      else {
        load_buffer_16bit_to_16bit_flip
                  ((int16_t *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),iVar6,
                   in_stack_fffffffffffff990,in_stack_fffffffffffff98c);
      }
      round_shift_16bit((__m128i *)local_228,0x20,(int)*piVar5);
      (*p_Var3)((__m128i *)local_228,(__m128i *)local_228,iVar1);
      round_shift_16bit((__m128i *)local_228,0x20,(int)piVar5[1]);
      transpose_16bit_8x8(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      transpose_16bit_8x8(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      transpose_16bit_8x8(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      transpose_16bit_8x8(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    }
    for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
      if (in_stack_fffffffffffff9a0 == 0) {
        out = (__m128i *)(local_628 + (long)(iVar7 << 4) * 2);
      }
      else {
        out = (__m128i *)local_228;
        flip_buf_sse2((__m128i *)(local_628 + (long)(iVar7 << 4) * 2),out,0x10);
      }
      (*p_Var4)(out,out,iVar2);
      round_shift_16bit(out,0x10,(int)piVar5[2]);
      store_rect_buffer_16bit_to_32bit_w8
                ((__m128i *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (int32_t *)CONCAT44(iVar6,iVar7),(int)((ulong)out >> 0x20),(int)out);
    }
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x32_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 2; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0 + 0 * 8, buf1 + 0 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 1 * 8, buf1 + 1 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 2 * 8, buf1 + 2 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 3 * 8, buf1 + 3 * width + 8 * i);
    }

    for (int i = 0; i < 4; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_16x32_c(input, output, stride, tx_type, bd);
  }
}